

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

Vec_Bit_t * Wlc_NtkAbsMarkOpers(Wlc_Ntk_t *p,Wlc_Par_t *pPars,Vec_Bit_t *vUnmark,int fVerbose)

{
  int iVar1;
  Vec_Bit_t *p_00;
  Wlc_Obj_t *p_01;
  uint local_58;
  uint local_54;
  int Count [4];
  int local_3c;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Bit_t *vLeaves;
  int fVerbose_local;
  Vec_Bit_t *vUnmark_local;
  Wlc_Par_t *pPars_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_NtkObjNumMax(p);
  p_00 = Vec_BitStart(iVar1);
  memset(&local_58,0,0x10);
  for (local_3c = 1; iVar1 = Wlc_NtkObjNumMax(p), local_3c < iVar1; local_3c = local_3c + 1) {
    p_01 = Wlc_NtkObj(p,local_3c);
    if ((vUnmark == (Vec_Bit_t *)0x0) || (iVar1 = Vec_BitEntry(vUnmark,local_3c), iVar1 == 0)) {
      if (((undefined1  [24])((undefined1  [24])*p_01 & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x2b) ||
         (((undefined1  [24])((undefined1  [24])*p_01 & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x2c ||
          ((undefined1  [24])((undefined1  [24])*p_01 & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x32)))) {
        iVar1 = Wlc_ObjRange(p_01);
        if (pPars->nBitsAdd <= iVar1) {
          iVar1 = Wlc_ObjId(p,p_01);
          Vec_BitWriteEntry(p_00,iVar1,1);
          local_58 = local_58 + 1;
        }
      }
      else if (((((undefined1  [24])((undefined1  [24])*p_01 & (undefined1  [24])0x3f) ==
                  (undefined1  [24])0x2d) ||
                ((undefined1  [24])((undefined1  [24])*p_01 & (undefined1  [24])0x3f) ==
                 (undefined1  [24])0x2e)) ||
               ((undefined1  [24])((undefined1  [24])*p_01 & (undefined1  [24])0x3f) ==
                (undefined1  [24])0x2f)) ||
              ((undefined1  [24])((undefined1  [24])*p_01 & (undefined1  [24])0x3f) ==
               (undefined1  [24])0x30)) {
        iVar1 = Wlc_ObjRange(p_01);
        if (pPars->nBitsMul <= iVar1) {
          iVar1 = Wlc_ObjId(p,p_01);
          Vec_BitWriteEntry(p_00,iVar1,1);
          local_54 = local_54 + 1;
        }
      }
      else if ((undefined1  [24])((undefined1  [24])*p_01 & (undefined1  [24])0x3f) ==
               (undefined1  [24])0x8) {
        iVar1 = Wlc_ObjRange(p_01);
        if (pPars->nBitsMux <= iVar1) {
          iVar1 = Wlc_ObjId(p,p_01);
          Vec_BitWriteEntry(p_00,iVar1,1);
          Count[0] = Count[0] + 1;
        }
      }
      else {
        iVar1 = Wlc_ObjIsCi(p_01);
        if (((iVar1 != 0) && (iVar1 = Wlc_ObjIsPi(p_01), iVar1 == 0)) &&
           (iVar1 = Wlc_ObjRange(p_01), pPars->nBitsFlop <= iVar1)) {
          iVar1 = Wlc_ObjId(p,p_01);
          Vec_BitWriteEntry(p_00,iVar1,1);
          Count[1] = Count[1] + 1;
        }
      }
    }
  }
  if (fVerbose != 0) {
    printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away.\n"
           ,(ulong)local_58,(ulong)local_54,(ulong)(uint)Count[0],(ulong)(uint)Count[1]);
  }
  return p_00;
}

Assistant:

static Vec_Bit_t * Wlc_NtkAbsMarkOpers( Wlc_Ntk_t * p, Wlc_Par_t * pPars, Vec_Bit_t * vUnmark, int fVerbose )
{
    Vec_Bit_t * vLeaves = Vec_BitStart( Wlc_NtkObjNumMax(p) );
    Wlc_Obj_t * pObj; int i, Count[4] = {0};
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( vUnmark && Vec_BitEntry(vUnmark, i) ) // not allow this object to be abstracted away
            continue;
        if ( pObj->Type == WLC_OBJ_ARI_ADD || pObj->Type == WLC_OBJ_ARI_SUB || pObj->Type == WLC_OBJ_ARI_MINUS )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsAdd )
                Vec_BitWriteEntry( vLeaves, Wlc_ObjId(p, pObj), 1 ), Count[0]++;
            continue;
        }
        if ( pObj->Type == WLC_OBJ_ARI_MULTI || pObj->Type == WLC_OBJ_ARI_DIVIDE || pObj->Type == WLC_OBJ_ARI_REM || pObj->Type == WLC_OBJ_ARI_MODULUS )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsMul )
                Vec_BitWriteEntry( vLeaves, Wlc_ObjId(p, pObj), 1 ), Count[1]++;
            continue;
        }
        if ( pObj->Type == WLC_OBJ_MUX )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsMux )
                Vec_BitWriteEntry( vLeaves, Wlc_ObjId(p, pObj), 1 ), Count[2]++;
            continue;
        }
        if ( Wlc_ObjIsCi(pObj) && !Wlc_ObjIsPi(pObj) )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsFlop )
                Vec_BitWriteEntry( vLeaves, Wlc_ObjId(p, pObj), 1 ), Count[3]++;
            continue;
        }
    }
    if ( fVerbose )
        printf( "Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away.\n", Count[0], Count[1], Count[2], Count[3] );
    return vLeaves;
}